

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Print.cpp
# Opt level: O2

bool wasm::anon_unknown_0::isFullForced(void)

{
  int iVar1;
  char *__s;
  bool bVar2;
  string local_38;
  allocator<char> local_11;
  
  if (wasm::(anonymous_namespace)::isFullForced()::full == '\0') {
    iVar1 = __cxa_guard_acquire(&wasm::(anonymous_namespace)::isFullForced()::full);
    if (iVar1 != 0) {
      __s = getenv("BINARYEN_PRINT_FULL");
      if (__s == (char *)0x0) {
        bVar2 = false;
      }
      else {
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,__s,&local_11);
        iVar1 = std::__cxx11::stoi(&local_38,(size_t *)0x0,10);
        bVar2 = iVar1 != 0;
        std::__cxx11::string::~string((string *)&local_38);
      }
      isFullForced::full = bVar2;
      __cxa_guard_release(&wasm::(anonymous_namespace)::isFullForced()::full);
    }
  }
  return isFullForced::full;
}

Assistant:

bool isFullForced() {
  static bool full = checkIsFullForced();
  return full;
}